

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

int __thiscall
CEditor::DoProperties(CEditor *this,CUIRect *pToolBox,CProperty *pProps,int *pIDs,int *pNewVal)

{
  CUI *this_00;
  vec3 *pvVar1;
  vec3 *pvVar2;
  anon_union_4_3_4e90b0cd_for_vector3_base<float>_3 *paVar3;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 *paVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  byte bVar8;
  uint uVar9;
  anon_union_4_2_94730227_for_vector4_base<float>_1 aVar10;
  anon_union_4_3_4e90b0cd_for_vector3_base<float>_3 aVar11;
  int iVar12;
  uint Checked;
  char *pText;
  uint uVar13;
  int *piVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long in_FS_OFFSET;
  anon_union_4_2_94730227_for_vector4_base<float>_1 aVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  CUIRect Down;
  CUIRect Up;
  CUIRect Yes;
  CUIRect Shifter;
  CUIRect Label;
  CUIRect Slot;
  CUIRect No;
  int local_13c;
  int *local_f8;
  vec4 local_e8;
  vec4 local_d8;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_c8;
  anon_union_4_2_94730227_for_vector4_base<float>_1 aStack_c4;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_c0;
  anon_union_4_2_94730017_for_vector4_base<float>_7 local_bc;
  CUIRect local_b8;
  CUIRect local_a8;
  CUIRect local_98;
  CUIRect local_88;
  CUIRect local_78 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pProps->m_pName == (char *)0x0) {
    local_13c = -1;
  }
  else {
    this_00 = &this->m_UI;
    pvVar1 = &this->m_InitialPickerColor;
    pvVar2 = &this->m_SelectedPickerColor;
    local_13c = -1;
    lVar17 = 0;
    local_f8 = pIDs;
    do {
      CUIRect::HSplitTop(pToolBox,13.0,&local_88,pToolBox);
      CUIRect::VSplitMid(&local_88,&local_98,&local_a8,0.0);
      CUIRect::HMargin(&local_a8,1.0,&local_a8);
      CUI::DoLabel(this_00,&local_98,pProps[lVar17].m_pName,10.0,0,-1.0,true);
      iVar15 = (int)lVar17;
      switch(pProps[lVar17].m_Type) {
      case 1:
        CUIRect::VSplitMid(&local_a8,local_78,&local_b8,0.0);
        iVar12 = DoButton_ButtonDec(this,pIDs + lVar17,"No",(uint)(pProps[lVar17].m_Value == 0),
                                    local_78,0,"");
        if (iVar12 != 0) {
          *pNewVal = 0;
          local_13c = iVar15;
        }
        iVar12 = DoButton_ButtonInc(this,(void *)((long)(pIDs + lVar17) + 1),"Yes",
                                    pProps[lVar17].m_Value,&local_b8,0,"");
        if (iVar12 != 0) {
          *pNewVal = 1;
          local_13c = iVar15;
        }
        break;
      case 2:
        CUIRect::VSplitRight(&local_a8,10.0,&local_a8,&local_b8);
        CUIRect::VSplitLeft(&local_a8,10.0,(CUIRect *)&local_c8,&local_a8);
        str_format((char *)local_78,0x40,"%d",(ulong)(uint)pProps[lVar17].m_Value);
        local_d8.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
        local_d8.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
        local_d8.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
        local_d8.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
        CUIRect::Draw(&local_a8,&local_d8,0.0,0);
        CUI::DoLabel(this_00,&local_a8,(char *)local_78,10.0,1,-1.0,true);
        iVar12 = DoButton_ButtonDec(this,pIDs + lVar17,(char *)0x0,0,(CUIRect *)&local_c8,0,
                                    "Decrease");
        if (iVar12 != 0) {
          *pNewVal = pProps[lVar17].m_Value + -1;
          local_13c = iVar15;
        }
        iVar12 = DoButton_ButtonInc(this,(void *)((long)(pIDs + lVar17) + 1),(char *)0x0,0,&local_b8
                                    ,0,"Increase");
        if (iVar12 != 0) {
          *pNewVal = pProps[lVar17].m_Value + 1;
          local_13c = iVar15;
        }
        break;
      case 3:
        iVar12 = UiDoValueSelector(this,pIDs + lVar17,&local_a8,"",pProps[lVar17].m_Value,
                                   pProps[lVar17].m_Min,pProps[lVar17].m_Max,1,1.0,
                                   "Use left mouse button to drag and change the value. Hold shift to be more precise."
                                  );
        if (iVar12 != pProps[lVar17].m_Value) {
LAB_0019b667:
          *pNewVal = iVar12;
          local_13c = iVar15;
        }
        break;
      case 4:
        CUIRect::HSplitTop(pToolBox,39.0,&local_88,pToolBox);
        CUIRect::VSplitMid(&local_88,local_78,&local_b8,0.0);
        CUIRect::HMargin(local_78,1.0,local_78);
        CUIRect::VMargin(local_78,6.0,local_78);
        lVar16 = 0;
        uVar13 = 0;
        piVar14 = local_f8;
        do {
          bVar8 = *(byte *)((long)DoProperties::s_aShift + lVar16);
          iVar12 = UiDoValueSelector(this,piVar14,&local_a8,
                                     (char *)((long)&
                                                  _ZZN7CEditor12DoPropertiesEP7CUIRectP9CPropertyPiS4_E9s_paTexts_rel
                                             + (long)*(int *)((long)&
                                                  _ZZN7CEditor12DoPropertiesEP7CUIRectP9CPropertyPiS4_E9s_paTexts_rel
                                                  + lVar16)),
                                     pProps[lVar17].m_Value >> (bVar8 & 0x1f) & 0xff,0,0xff,1,1.0,
                                     "Use left mouse button to drag and change the color value. Hold shift to be more precise."
                                    );
          if (lVar16 != 0xc) {
            CUIRect::HSplitTop(&local_b8,13.0,&local_a8,&local_b8);
            CUIRect::HMargin(&local_a8,1.0,&local_a8);
          }
          uVar13 = uVar13 | iVar12 << (bVar8 & 0x1f);
          lVar16 = lVar16 + 4;
          piVar14 = (int *)((long)piVar14 + 1);
        } while (lVar16 != 0x10);
        uVar9 = pProps[lVar17].m_Value;
        Checked = uVar9 >> 0x18;
        local_c0.x = (float)(uVar9 >> 8 & 0xff) / 255.0;
        auVar22._0_4_ = (float)Checked;
        auVar22._4_4_ = (float)(uVar9 >> 0x10 & 0xff);
        auVar22._8_8_ = 0;
        auVar22 = divps(auVar22,_DAT_001dc020);
        _local_c8 = auVar22._0_8_;
        local_bc.w = 1.0;
        CUIRect::Draw(local_78,(vec4 *)&local_c8,0.0,0);
        iVar12 = DoButton_Editor_Common
                           (this,&DoProperties::s_ColorPicker,pText,Checked,local_78,0,(char *)0x0);
        if (iVar12 != 0) {
          aVar10 = local_c8;
          if (aStack_c4.x <= local_c8.x) {
            aVar10 = aStack_c4;
          }
          if (local_c0.x <= aVar10.x) {
            aVar10 = local_c0;
          }
          aVar18 = local_c8;
          if (local_c8.x <= aStack_c4.x) {
            aVar18 = aStack_c4;
          }
          if (aVar18.x <= local_c0.x) {
            aVar18 = local_c0;
          }
          fVar25 = 0.0;
          if ((aVar18.x != aVar10.x) || (NAN(aVar18.x) || NAN(aVar10.x))) {
            fVar25 = aVar18.x - aVar10.x;
            if ((aVar18.x != local_c8.x) || (NAN(aVar18.x) || NAN(local_c8.x))) {
              if ((aVar18.x != aStack_c4.x) || (NAN(aVar18.x) || NAN(aStack_c4.x))) {
                fVar25 = (local_c8.x - aStack_c4.x) / fVar25 + 4.0;
              }
              else {
                fVar25 = (local_c0.x - local_c8.x) / fVar25 + 2.0;
              }
            }
            else {
              fVar25 = (aStack_c4.x - local_c0.x) / fVar25;
            }
          }
          fVar25 = fVar25 / 6.0;
          (this->m_InitialPickerColor).field_0 =
               (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)
               (~-(uint)(fVar25 < 0.0) & (uint)fVar25 | (uint)(fVar25 + 1.0) & -(uint)(fVar25 < 0.0)
               );
          (this->m_InitialPickerColor).field_1 =
               (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)
               (-(uint)(aVar18.x != 0.0) & (uint)((aVar18.x - aVar10.x) / aVar18.x));
          (this->m_InitialPickerColor).field_2.z = (float)aVar18;
          (this->m_SelectedPickerColor).field_2 = (this->m_InitialPickerColor).field_2;
          aVar11 = pvVar1->field_1;
          pvVar2->field_0 = pvVar1->field_0;
          pvVar2->field_1 = aVar11;
          CUI::DoPopupMenu(this_00,(int)(this->m_UI).m_MouseX,(int)(this->m_UI).m_MouseY,0xb4,0xb4,
                           this,PopupColorPicker,0xf);
        }
        if (((pvVar1->field_0).x != (pvVar2->field_0).x) ||
           (NAN((pvVar1->field_0).x) || NAN((pvVar2->field_0).x))) {
LAB_0019b798:
          (this->m_InitialPickerColor).field_2 = (this->m_SelectedPickerColor).field_2;
          aVar11 = pvVar2->field_1;
          pvVar1->field_0 = pvVar2->field_0;
          pvVar1->field_1 = aVar11;
          uVar6 = (this->m_SelectedPickerColor).field_0;
          uVar7 = (this->m_SelectedPickerColor).field_1;
          fVar25 = (float)uVar6 * 6.0;
          if ((uint)((int)fVar25 % 6) < 6) {
            fVar5 = (this->m_SelectedPickerColor).field_2.z;
            fVar19 = (1.0 - (float)uVar7) * fVar5;
            fVar24 = (1.0 - (float)uVar7 * (fVar25 - (float)(int)fVar25)) * fVar5;
            fVar23 = (1.0 - (1.0 - (fVar25 - (float)(int)fVar25)) * (float)uVar7) * fVar5;
            fVar20 = fVar5;
            fVar21 = fVar5;
            switch((int)fVar25 % 6) {
            case 0:
              fVar20 = fVar19;
              fVar24 = fVar23;
              break;
            case 1:
              fVar20 = fVar19;
              fVar21 = fVar24;
              fVar24 = fVar5;
              break;
            case 2:
              fVar20 = fVar23;
              fVar21 = fVar19;
              fVar24 = fVar5;
              break;
            case 3:
              fVar21 = fVar19;
              break;
            case 4:
              fVar21 = fVar23;
              fVar24 = fVar19;
              break;
            case 5:
              fVar20 = fVar24;
              fVar24 = fVar19;
            }
          }
          else {
            fVar20 = 0.0;
            fVar21 = 0.0;
            fVar24 = 0.0;
          }
          uVar13 = (uint)(byte)pProps[lVar17].m_Value |
                   ((int)(fVar20 * 255.0) & 0xffU) << 8 |
                   ((int)(fVar24 * 255.0) & 0xffU) << 0x10 | (int)(fVar21 * 255.0) << 0x18;
        }
        else {
          fVar25 = (this->m_InitialPickerColor).field_1.y;
          paVar3 = &(this->m_SelectedPickerColor).field_1;
          if ((fVar25 != paVar3->y) || (NAN(fVar25) || NAN(paVar3->y))) goto LAB_0019b798;
          fVar25 = (this->m_InitialPickerColor).field_2.z;
          paVar4 = &(this->m_SelectedPickerColor).field_2;
          if ((fVar25 != paVar4->z) || (NAN(fVar25) || NAN(paVar4->z))) goto LAB_0019b798;
        }
        if (uVar13 != pProps[lVar17].m_Value) {
          *pNewVal = uVar13;
          local_13c = iVar15;
        }
        break;
      case 5:
        if (pProps[lVar17].m_Value < 0) {
          str_copy((char *)local_78,"None",0x40);
        }
        else {
          str_format((char *)local_78,0x40,"%s");
        }
        iVar12 = DoButton_Editor(this,pIDs + lVar17,(char *)local_78,0,&local_a8,0,(char *)0x0);
        if (iVar12 != 0) {
          PopupSelectImageInvoke
                    (this,pProps[lVar17].m_Value,(this->m_UI).m_MouseX,(this->m_UI).m_MouseY);
        }
        iVar12 = PopupSelectImageResult(this);
        if (-2 < iVar12) goto LAB_0019b667;
        break;
      case 7:
        CUIRect::VSplitMid(&local_a8,local_78,(CUIRect *)&local_c8,2.0);
        CUIRect::VSplitLeft(local_78,10.0,local_78,&local_a8);
        CUIRect::VSplitRight(&local_a8,10.0,&local_a8,&local_b8);
        local_d8.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
        local_d8.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
        local_d8.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
        local_d8.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
        CUIRect::Draw(&local_a8,&local_d8,0.0,0);
        CUI::DoLabel(this_00,&local_a8,"X",10.0,1,-1.0,true);
        CUIRect::VSplitLeft((CUIRect *)&local_c8,10.0,(CUIRect *)&local_c8,&local_a8);
        CUIRect::VSplitRight(&local_a8,10.0,&local_a8,(CUIRect *)&local_d8);
        local_e8.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
        local_e8.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
        local_e8.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
        local_e8.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
        CUIRect::Draw(&local_a8,&local_e8,0.0,0);
        CUI::DoLabel(this_00,&local_a8,"Y",10.0,1,-1.0,true);
        piVar14 = pIDs + lVar17;
        iVar12 = DoButton_ButtonDec(this,piVar14,"-",0,local_78,0,"Left");
        if (iVar12 != 0) {
          *pNewVal = 1;
          local_13c = iVar15;
        }
        iVar12 = DoButton_ButtonInc(this,(void *)((long)piVar14 + 3),"+",0,&local_b8,0,"Right");
        if (iVar12 != 0) {
          *pNewVal = 2;
          local_13c = iVar15;
        }
        iVar12 = DoButton_ButtonDec(this,(void *)((long)piVar14 + 1),"-",0,(CUIRect *)&local_c8,0,
                                    "Up");
        if (iVar12 != 0) {
          *pNewVal = 4;
          local_13c = iVar15;
        }
        iVar12 = DoButton_ButtonInc(this,(void *)((long)piVar14 + 2),"+",0,(CUIRect *)&local_d8,0,
                                    "Down");
        if (iVar12 != 0) {
          *pNewVal = 8;
          local_13c = iVar15;
        }
      }
      lVar17 = lVar17 + 1;
      local_f8 = local_f8 + 1;
    } while (pProps[lVar17].m_pName != (char *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_13c;
}

Assistant:

int CEditor::DoProperties(CUIRect *pToolBox, CProperty *pProps, int *pIDs, int *pNewVal)
{
	int Change = -1;

	for(int i = 0; pProps[i].m_pName; i++)
	{
		CUIRect Slot;
		pToolBox->HSplitTop(13.0f, &Slot, pToolBox);
		CUIRect Label, Shifter;
		Slot.VSplitMid(&Label, &Shifter);
		Shifter.HMargin(1.0f, &Shifter);
		UI()->DoLabel(&Label, pProps[i].m_pName, 10.0f, TEXTALIGN_LEFT);

		if(pProps[i].m_Type == PROPTYPE_INT_STEP)
		{
			CUIRect Inc, Dec;
			char aBuf[64];

			Shifter.VSplitRight(10.0f, &Shifter, &Inc);
			Shifter.VSplitLeft(10.0f, &Dec, &Shifter);
			str_format(aBuf, sizeof(aBuf),"%d", pProps[i].m_Value);
			Shifter.Draw(vec4(1,1,1,0.5f), 0.0f, CUIRect::CORNER_NONE);
			UI()->DoLabel(&Shifter, aBuf, 10.0f,TEXTALIGN_CENTER);

			if(DoButton_ButtonDec(&pIDs[i], 0, 0, &Dec, 0, "Decrease"))
			{
				*pNewVal = pProps[i].m_Value-1;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+1, 0, 0, &Inc, 0, "Increase"))
			{
				*pNewVal = pProps[i].m_Value+1;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_BOOL)
		{
			CUIRect No, Yes;
			Shifter.VSplitMid(&No, &Yes);
			if(DoButton_ButtonDec(&pIDs[i], "No", !pProps[i].m_Value, &No, 0, ""))
			{
				*pNewVal = 0;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+1, "Yes", pProps[i].m_Value, &Yes, 0, ""))
			{
				*pNewVal = 1;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_INT_SCROLL)
		{
			int NewValue = UiDoValueSelector(&pIDs[i], &Shifter, "", pProps[i].m_Value, pProps[i].m_Min, pProps[i].m_Max, 1, 1.0f, "Use left mouse button to drag and change the value. Hold shift to be more precise.");
			if(NewValue != pProps[i].m_Value)
			{
				*pNewVal = NewValue;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_COLOR)
		{
			static const char *s_paTexts[4] = {"R", "G", "B", "A"};
			static int s_aShift[] = {24, 16, 8, 0};
			int NewColor = 0;

			// extra space
			CUIRect ColorBox, ColorSlots;

			pToolBox->HSplitTop(3.0f*13.0f, &Slot, pToolBox);
			Slot.VSplitMid(&ColorBox, &ColorSlots);
			ColorBox.HMargin(1.0f, &ColorBox);
			ColorBox.VMargin(6.0f, &ColorBox);

			for(int c = 0; c < 4; c++)
			{
				int v = (pProps[i].m_Value >> s_aShift[c])&0xff;
				NewColor |= UiDoValueSelector(((char *)&pIDs[i])+c, &Shifter, s_paTexts[c], v, 0, 255, 1, 1.0f, "Use left mouse button to drag and change the color value. Hold shift to be more precise.")<<s_aShift[c];

				if(c != 3)
				{
					ColorSlots.HSplitTop(13.0f, &Shifter, &ColorSlots);
					Shifter.HMargin(1.0f, &Shifter);
				}
			}

			// color picker
			vec4 Color = vec4(
				((pProps[i].m_Value >> s_aShift[0])&0xff)/255.0f,
				((pProps[i].m_Value >> s_aShift[1])&0xff)/255.0f,
				((pProps[i].m_Value >> s_aShift[2])&0xff)/255.0f,
				1.0f);

			ColorBox.Draw(Color, 0.0f, CUIRect::CORNER_NONE);
			static int s_ColorPicker;
			if(DoButton_Editor_Common(&s_ColorPicker, 0x0, 0, &ColorBox, 0, 0x0))
			{
				m_InitialPickerColor = RgbToHsv(vec3(Color.r, Color.g, Color.b));
				m_SelectedPickerColor = m_InitialPickerColor;
				UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 180, 180, this, PopupColorPicker);
			}

			if(m_InitialPickerColor != m_SelectedPickerColor)
			{
				m_InitialPickerColor = m_SelectedPickerColor;
				vec3 c = HsvToRgb(m_SelectedPickerColor);
				NewColor = ((int)(c.r * 255.0f)&0xff) << 24 | ((int)(c.g * 255.0f)&0xff) << 16 | ((int)(c.b * 255.0f)&0xff) << 8 | (pProps[i].m_Value&0xff);
			}

			if(NewColor != pProps[i].m_Value)
			{
				*pNewVal = NewColor;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_IMAGE)
		{
			char aBuf[64];
			if(pProps[i].m_Value < 0)
				str_copy(aBuf, "None", sizeof(aBuf));
			else
				str_format(aBuf, sizeof(aBuf),"%s", m_Map.m_lImages[pProps[i].m_Value]->m_aName);

			if(DoButton_Editor(&pIDs[i], aBuf, 0, &Shifter, 0, 0))
				PopupSelectImageInvoke(pProps[i].m_Value, UI()->MouseX(), UI()->MouseY());

			int r = PopupSelectImageResult();
			if(r >= -1)
			{
				*pNewVal = r;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_SHIFT)
		{
			CUIRect Left, Right, Up, Down;
			Shifter.VSplitMid(&Left, &Up, 2.0f);
			Left.VSplitLeft(10.0f, &Left, &Shifter);
			Shifter.VSplitRight(10.0f, &Shifter, &Right);
			Shifter.Draw(vec4(1,1,1,0.5f), 0.0f, CUIRect::CORNER_NONE);
			UI()->DoLabel(&Shifter, "X", 10.0f, TEXTALIGN_CENTER);
			Up.VSplitLeft(10.0f, &Up, &Shifter);
			Shifter.VSplitRight(10.0f, &Shifter, &Down);
			Shifter.Draw(vec4(1,1,1,0.5f), 0.0f, CUIRect::CORNER_NONE);
			UI()->DoLabel(&Shifter, "Y", 10.0f, TEXTALIGN_CENTER);
			if(DoButton_ButtonDec(&pIDs[i], "-", 0, &Left, 0, "Left"))
			{
				*pNewVal = 1;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+3, "+", 0, &Right, 0, "Right"))
			{
				*pNewVal = 2;
				Change = i;
			}
			if(DoButton_ButtonDec(((char *)&pIDs[i])+1, "-", 0, &Up, 0, "Up"))
			{
				*pNewVal = 4;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+2, "+", 0, &Down, 0, "Down"))
			{
				*pNewVal = 8;
				Change = i;
			}
		}
	}

	return Change;
}